

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp analyze_list(sexp ctx,sexp x,int depth,int defok)

{
  ulong uVar1;
  int iVar2;
  sexp x_00;
  sexp psVar3;
  sexp res;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp local_68;
  sexp local_60;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  
  local_58.var = &local_68;
  local_48.next = &local_58;
  local_48.var = &local_60;
  local_60 = (sexp)&DAT_0000043e;
  local_58.next = (ctx->value).context.saves;
  (ctx->value).context.saves = local_48.next;
  (ctx->value).context.saves = &local_48;
  local_68 = (sexp)&DAT_0000023e;
  uVar1 = (ulong)x & 3;
  while ((x_00 = local_68, uVar1 == 0 && (x->tag == 6))) {
    sexp_push_op(ctx,&local_68,(sexp)&DAT_0000003e);
    x_00 = analyze(ctx,(x->value).type.name,depth,defok);
    local_60 = x_00;
    if ((((ulong)x_00 & 3) == 0) && (x_00->tag == 0x13)) break;
    psVar3 = (ctx->value).type.cpl;
    if (((ulong)psVar3 & 3) == 0 && psVar3 != (sexp)0x0) {
      while (psVar3->tag == 0x17) {
        if ((psVar3->value).type.cpl != (sexp)0x0) {
          iVar2 = nondefp(x_00);
          defok = defok | -(uint)(iVar2 != 0);
          break;
        }
        psVar3 = (psVar3->value).type.name;
        if ((psVar3 == (sexp)0x0) || (((ulong)psVar3 & 3) != 0)) break;
      }
    }
    (local_68->value).type.slots = (x->value).type.slots;
    (local_68->value).type.name = x_00;
    x = (x->value).type.cpl;
    uVar1 = (ulong)x & 3;
  }
  local_68 = x_00;
  if ((((ulong)local_68 & 3) == 0) && (local_68->tag == 6)) {
    local_68 = sexp_nreverse_op(ctx,(sexp)0x0,1,local_68);
  }
  (ctx->value).context.saves = local_58.next;
  return local_68;
}

Assistant:

static sexp analyze_list (sexp ctx, sexp x, int depth, int defok) {
  sexp_gc_var2(res, tmp);
  sexp_gc_preserve2(ctx, res, tmp);
  for (res=SEXP_NULL; sexp_pairp(x); x=sexp_cdr(x)) {
    sexp_push(ctx, res, SEXP_FALSE);
    tmp = analyze(ctx, sexp_car(x), depth, defok);
    if (sexp_exceptionp(tmp)) {
      res = tmp;
      break;
    } else {
      if (lambda_envp(ctx) && nondefp(tmp)) defok = -1;  /* -1 to warn */
      sexp_pair_source(res) = sexp_pair_source(x);
      sexp_car(res) = tmp;
    }
  }
  if (sexp_pairp(res)) res = sexp_nreverse(ctx, res);
  sexp_gc_release2(ctx);
  return res;
}